

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImproveCacheLocality.cpp
# Opt level: O3

ai_real __thiscall
Assimp::ImproveCacheLocalityProcess::ProcessMesh
          (ImproveCacheLocalityProcess *this,aiMesh *pMesh,uint meshNum)

{
  bool bVar1;
  uint *puVar2;
  aiFace *paVar3;
  void *__s;
  uint *puVar4;
  uint *puVar5;
  Logger *pLVar6;
  uint uVar7;
  ulong uVar8;
  uint *puVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  aiFace *paVar17;
  ulong uVar18;
  ulong uVar19;
  uint *puVar20;
  ai_real aVar21;
  float fVar22;
  stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> sDeadEndVStack;
  VertexTriangleAdjacency adj;
  vector<unsigned_int,_std::allocator<unsigned_int>_> piNumTriPtrNoModify;
  char szBuff [128];
  float local_2bc;
  int local_2a8;
  uint local_2a4;
  uint *local_278;
  iterator iStack_270;
  uint *local_268;
  ulong local_260;
  uint *local_258;
  aiFace *local_250;
  ulong local_248;
  aiMesh *local_240;
  ulong local_238;
  uint *local_230;
  VertexTriangleAdjacency local_228;
  vector<bool,_std::allocator<bool>_> local_208;
  void *local_1e0 [3];
  char *local_1c8 [2];
  char local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if (pMesh == (aiMesh *)0x0) {
    __assert_fail("nullptr != pMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ImproveCacheLocality.cpp"
                  ,0x7a,
                  "ai_real Assimp::ImproveCacheLocalityProcess::ProcessMesh(aiMesh *, unsigned int)"
                 );
  }
  if (pMesh->mNumFaces == 0 || pMesh->mFaces == (aiFace *)0x0) {
    return 0.0;
  }
  if (pMesh->mNumVertices == 0 || pMesh->mVertices == (aiVector3D *)0x0) {
    return 0.0;
  }
  if (pMesh->mPrimitiveTypes != 4) {
    pLVar6 = DefaultLogger::get();
    Logger::error(pLVar6,"This algorithm works on triangle meshes only");
    return 0.0;
  }
  if (pMesh->mNumVertices <= this->mConfigCacheDepth) {
    return 0.0;
  }
  paVar17 = pMesh->mFaces + pMesh->mNumFaces;
  bVar1 = DefaultLogger::isNullLogger();
  if (bVar1) {
    uVar16 = pMesh->mNumFaces;
    local_2bc = 3.0;
  }
  else {
    uVar16 = this->mConfigCacheDepth;
    uVar19 = (ulong)uVar16 * 4;
    puVar2 = (uint *)operator_new__(uVar19);
    memset(puVar2,0xff,uVar19);
    paVar3 = pMesh->mFaces;
    if (paVar3 == paVar17) {
      local_2bc = 0.0;
    }
    else {
      uVar7 = 0;
      puVar4 = puVar2;
      do {
        lVar12 = 0;
        do {
          puVar5 = puVar2;
          if (uVar16 != 0) {
            do {
              if (*puVar5 == paVar3->mIndices[lVar12]) goto LAB_001561cf;
              puVar5 = puVar5 + 1;
            } while (puVar5 < puVar2 + uVar16);
          }
          uVar7 = uVar7 + 1;
          if (puVar2 + uVar16 == puVar4) {
            puVar4 = puVar2;
          }
          *puVar4 = paVar3->mIndices[lVar12];
          puVar4 = puVar4 + 1;
LAB_001561cf:
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        paVar3 = paVar3 + 1;
      } while (paVar3 != paVar17);
      local_2bc = (float)uVar7;
    }
    operator_delete__(puVar2);
    uVar16 = pMesh->mNumFaces;
    local_2bc = local_2bc / (float)uVar16;
    if ((local_2bc == 3.0) && (!NAN(local_2bc))) {
      snprintf(local_1a8,0x80,"Mesh %u: Not suitable for vcache optimization",(ulong)meshNum);
      pLVar6 = DefaultLogger::get();
      Logger::warn(pLVar6,local_1a8);
      return 0.0;
    }
  }
  VertexTriangleAdjacency::VertexTriangleAdjacency
            (&local_228,pMesh->mFaces,uVar16,pMesh->mNumVertices,true);
  uVar19 = (ulong)pMesh->mNumVertices << 2;
  __s = operator_new__(uVar19);
  memset(__s,0,uVar19);
  uVar16 = pMesh->mNumFaces;
  puVar4 = (uint *)operator_new__((ulong)(uVar16 * 3) << 2);
  local_1a8._0_4_ = local_1a8._0_4_ & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_208,(ulong)uVar16,(bool *)local_1a8,(allocator_type *)local_1c8);
  puVar2 = local_228.mLiveTriangles;
  local_278 = (uint *)0x0;
  iStack_270._M_current = (uint *)0x0;
  local_268 = (uint *)0x0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1e0,local_228.mLiveTriangles
             ,local_228.mLiveTriangles + pMesh->mNumVertices,(allocator_type *)local_1a8);
  if ((ulong)pMesh->mNumVertices != 0) {
    lVar12 = 0;
    uVar16 = 0;
    do {
      uVar7 = *(uint *)((long)local_228.mLiveTriangles + lVar12);
      if (*(uint *)((long)local_228.mLiveTriangles + lVar12) < uVar16) {
        uVar7 = uVar16;
      }
      uVar16 = uVar7;
      lVar12 = lVar12 + 4;
    } while ((ulong)pMesh->mNumVertices << 2 != lVar12);
    if (uVar16 != 0) {
      local_250 = paVar17;
      puVar5 = (uint *)operator_new__((ulong)(uVar16 * 3) << 2);
      iVar11 = this->mConfigCacheDepth + 1;
      local_2a8 = 1;
      uVar19 = 0;
      local_2a4 = 0;
      local_258 = puVar4;
      local_240 = pMesh;
      do {
        uVar16 = (uint)uVar19;
        if (local_228.mNumVertices <= uVar16) {
          __assert_fail("iVertIndex < mNumVertices",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/VertexTriangleAdjacency.h"
                        ,0x57,
                        "unsigned int *Assimp::VertexTriangleAdjacency::GetAdjacentTriangles(unsigned int) const"
                       );
        }
        uVar19 = uVar19 & 0xffffffff;
        iVar10 = *(int *)((long)local_1e0[0] + uVar19 * 4);
        if (iVar10 == 0) {
          puVar2[uVar19] = 0;
LAB_00156591:
          do {
            puVar9 = iStack_270._M_current + -1;
            if (iStack_270._M_current == local_278) goto LAB_001565b8;
            uVar19 = (ulong)*puVar9;
            iStack_270._M_current = puVar9;
          } while (puVar2[uVar19] == 0);
          if (*puVar9 == 0xffffffff) {
LAB_001565b8:
            uVar8 = (long)local_2a8;
            do {
              if ((long)(int)pMesh->mNumVertices <= (long)uVar8) goto LAB_001565e7;
              uVar19 = uVar8 + 1;
              lVar12 = uVar8 + 1;
              uVar8 = uVar19;
            } while (puVar2[lVar12] == 0);
            local_2a8 = (int)uVar19;
          }
        }
        else {
          puVar9 = local_228.mAdjacencyTable + local_228.mOffsetTable[uVar19];
          iVar13 = 0;
          puVar20 = puVar5;
          local_248 = uVar19;
          do {
            uVar7 = *puVar9;
            uVar8 = (ulong)uVar7;
            uVar14 = 1L << ((byte)uVar7 & 0x3f);
            uVar15 = (ulong)(uVar7 >> 6);
            uVar19 = local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar15];
            if ((uVar19 >> (uVar8 & 0x3f) & 1) == 0) {
              paVar17 = pMesh->mFaces;
              uVar18 = (ulong)paVar17[uVar8].mNumIndices;
              local_260 = uVar15;
              local_238 = uVar14;
              local_230 = puVar9;
              if (uVar18 != 0) {
                lVar12 = 0;
                do {
                  local_1a8._0_4_ = *(uint *)((long)paVar17[uVar8].mIndices + lVar12);
                  uVar7 = uVar16;
                  if (uVar16 != local_1a8._0_4_) {
                    if (iStack_270._M_current == local_268) {
                      std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      _M_realloc_insert<unsigned_int_const&>
                                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_278,
                                 iStack_270,(uint *)local_1a8);
                    }
                    else {
                      *iStack_270._M_current = local_1a8._0_4_;
                      iStack_270._M_current = iStack_270._M_current + 1;
                    }
                    *puVar20 = local_1a8._0_4_;
                    puVar20 = puVar20 + 1;
                    puVar2[(uint)local_1a8._0_4_] = puVar2[(uint)local_1a8._0_4_] - 1;
                    uVar7 = local_1a8._0_4_;
                  }
                  *(uint *)((long)local_258 + lVar12) = uVar7;
                  if (this->mConfigCacheDepth <
                      (uint)(iVar11 - *(int *)((long)__s + (ulong)(uint)local_1a8._0_4_ * 4))) {
                    *(int *)((long)__s + (ulong)(uint)local_1a8._0_4_ * 4) = iVar11;
                    iVar11 = iVar11 + 1;
                    local_2a4 = local_2a4 + 1;
                  }
                  lVar12 = lVar12 + 4;
                } while (uVar18 << 2 != lVar12);
                uVar19 = local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_260];
                local_258 = (uint *)((long)local_258 + lVar12);
                pMesh = local_240;
              }
              local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[local_260] = uVar19 | local_238;
              puVar9 = local_230;
            }
            puVar9 = puVar9 + 1;
            iVar13 = iVar13 + 1;
          } while (iVar13 != iVar10);
          puVar2[local_248] = 0;
          if (puVar5 == puVar20) goto LAB_00156591;
          iVar10 = -1;
          uVar19 = 0xffffffff;
          puVar9 = puVar5;
          do {
            uVar16 = *puVar9;
            if (puVar2[uVar16] != 0) {
              iVar13 = iVar11 - *(int *)((long)__s + (ulong)uVar16 * 4);
              if (this->mConfigCacheDepth < iVar13 + puVar2[uVar16] * 2) {
                iVar13 = 0;
              }
              if (iVar10 < iVar13) {
                uVar19 = (ulong)uVar16;
                iVar10 = iVar13;
              }
            }
            puVar9 = puVar9 + 1;
          } while (puVar9 != puVar20);
          if ((int)uVar19 == -1) goto LAB_00156591;
        }
        if ((int)uVar19 < 0) {
LAB_001565e7:
          bVar1 = DefaultLogger::isNullLogger();
          paVar17 = local_250;
          aVar21 = 0.0;
          if (!bVar1) {
            uVar16 = pMesh->mNumFaces;
            pLVar6 = DefaultLogger::get();
            fVar22 = (float)local_2a4 / (float)uVar16;
            if (pLVar6->m_Severity == VERBOSE) {
              pLVar6 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[20]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,(char (*) [20])"Mesh %u | ACMR in: ");
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," out: ",6);
              std::ostream::_M_insert<double>((double)local_2bc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," | ~",4);
              std::ostream::_M_insert<double>((double)fVar22);
              std::ostream::_M_insert<double>((double)(((local_2bc - fVar22) / local_2bc) * 100.0));
              std::__cxx11::stringbuf::str();
              Logger::debug(pLVar6,local_1c8[0]);
              if (local_1c8[0] != local_1b8) {
                operator_delete(local_1c8[0]);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            }
            aVar21 = fVar22 * (float)pMesh->mNumFaces;
          }
          puVar2 = puVar4;
          for (paVar3 = pMesh->mFaces; paVar3 != paVar17; paVar3 = paVar3 + 1) {
            uVar16 = paVar3->mNumIndices;
            if (uVar16 != 0) {
              puVar9 = paVar3->mIndices;
              *puVar9 = *puVar2;
              if (uVar16 == 1) {
                puVar2 = puVar2 + 1;
              }
              else {
                puVar9[1] = puVar2[1];
                if (uVar16 < 3) {
                  puVar2 = puVar2 + 2;
                }
                else {
                  puVar20 = puVar2 + 2;
                  puVar2 = puVar2 + 3;
                  puVar9[2] = *puVar20;
                }
              }
            }
          }
          operator_delete__(__s);
          operator_delete__(puVar4);
          operator_delete__(puVar5);
          if (local_1e0[0] != (void *)0x0) {
            operator_delete(local_1e0[0]);
          }
          if (local_278 != (uint *)0x0) {
            operator_delete(local_278);
          }
          if (local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          }
          VertexTriangleAdjacency::~VertexTriangleAdjacency(&local_228);
          return aVar21;
        }
      } while( true );
    }
  }
  __assert_fail("iMaxRefTris > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ImproveCacheLocality.cpp"
                ,0xda,
                "ai_real Assimp::ImproveCacheLocalityProcess::ProcessMesh(aiMesh *, unsigned int)");
}

Assistant:

ai_real ImproveCacheLocalityProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshNum) {
    // TODO: rewrite this to use std::vector or boost::shared_array
    ai_assert(nullptr != pMesh);

    // Check whether the input data is valid
    // - there must be vertices and faces
    // - all faces must be triangulated or we can't operate on them
    if (!pMesh->HasFaces() || !pMesh->HasPositions())
        return static_cast<ai_real>(0.f);

    if (pMesh->mPrimitiveTypes != aiPrimitiveType_TRIANGLE) {
        ASSIMP_LOG_ERROR("This algorithm works on triangle meshes only");
        return static_cast<ai_real>(0.f);
    }

    if(pMesh->mNumVertices <= mConfigCacheDepth) {
        return static_cast<ai_real>(0.f);
    }

    ai_real fACMR = 3.f;
    const aiFace* const pcEnd = pMesh->mFaces+pMesh->mNumFaces;

    // Input ACMR is for logging purposes only
    if (!DefaultLogger::isNullLogger())     {

        unsigned int* piFIFOStack = new unsigned int[mConfigCacheDepth];
        memset(piFIFOStack,0xff,mConfigCacheDepth*sizeof(unsigned int));
        unsigned int* piCur = piFIFOStack;
        const unsigned int* const piCurEnd = piFIFOStack + mConfigCacheDepth;

        // count the number of cache misses
        unsigned int iCacheMisses = 0;
        for (const aiFace* pcFace = pMesh->mFaces;pcFace != pcEnd;++pcFace) {
            for (unsigned int qq = 0; qq < 3;++qq) {
                bool bInCache = false;
                for (unsigned int* pp = piFIFOStack;pp < piCurEnd;++pp) {
                    if (*pp == pcFace->mIndices[qq])    {
                        // the vertex is in cache
                        bInCache = true;
                        break;
                    }
                }
                if (!bInCache)  {
                    ++iCacheMisses;
                    if (piCurEnd == piCur) {
                        piCur = piFIFOStack;
                    }
                    *piCur++ = pcFace->mIndices[qq];
                }
            }
        }
        delete[] piFIFOStack;
        fACMR = (ai_real) iCacheMisses / pMesh->mNumFaces;
        if (3.0 == fACMR)   {
            char szBuff[128]; // should be sufficiently large in every case

            // the JoinIdenticalVertices process has not been executed on this
            // mesh, otherwise this value would normally be at least minimally
            // smaller than 3.0 ...
            ai_snprintf(szBuff,128,"Mesh %u: Not suitable for vcache optimization",meshNum);
            ASSIMP_LOG_WARN(szBuff);
            return static_cast<ai_real>(0.f);
        }
    }

    // first we need to build a vertex-triangle adjacency list
    VertexTriangleAdjacency adj(pMesh->mFaces,pMesh->mNumFaces, pMesh->mNumVertices,true);

    // build a list to store per-vertex caching time stamps
    unsigned int* const piCachingStamps = new unsigned int[pMesh->mNumVertices];
    memset(piCachingStamps,0x0,pMesh->mNumVertices*sizeof(unsigned int));

    // allocate an empty output index buffer. We store the output indices in one large array.
    // Since the number of triangles won't change the input faces can be reused. This is how
    // we save thousands of redundant mini allocations for aiFace::mIndices
    const unsigned int iIdxCnt = pMesh->mNumFaces*3;
    unsigned int* const piIBOutput = new unsigned int[iIdxCnt];
    unsigned int* piCSIter = piIBOutput;

    // allocate the flag array to hold the information
    // whether a face has already been emitted or not
    std::vector<bool> abEmitted(pMesh->mNumFaces,false);

    // dead-end vertex index stack
    std::stack<unsigned int, std::vector<unsigned int> > sDeadEndVStack;

    // create a copy of the piNumTriPtr buffer
    unsigned int* const piNumTriPtr = adj.mLiveTriangles;
    const std::vector<unsigned int> piNumTriPtrNoModify(piNumTriPtr, piNumTriPtr + pMesh->mNumVertices);

    // get the largest number of referenced triangles and allocate the "candidate buffer"
    unsigned int iMaxRefTris = 0; {
        const unsigned int* piCur = adj.mLiveTriangles;
        const unsigned int* const piCurEnd = adj.mLiveTriangles+pMesh->mNumVertices;
        for (;piCur != piCurEnd;++piCur) {
            iMaxRefTris = std::max(iMaxRefTris,*piCur);
        }
    }
    ai_assert(iMaxRefTris > 0);
    unsigned int* piCandidates = new unsigned int[iMaxRefTris*3];
    unsigned int iCacheMisses = 0;

    // ...................................................................................
    /** PSEUDOCODE for the algorithm

        A = Build-Adjacency(I) Vertex-triangle adjacency
        L = Get-Triangle-Counts(A) Per-vertex live triangle counts
        C = Zero(Vertex-Count(I)) Per-vertex caching time stamps
        D = Empty-Stack() Dead-end vertex stack
        E = False(Triangle-Count(I)) Per triangle emitted flag
        O = Empty-Index-Buffer() Empty output buffer
        f = 0 Arbitrary starting vertex
        s = k+1, i = 1 Time stamp and cursor
        while f >= 0 For all valid fanning vertices
            N = Empty-Set() 1-ring of next candidates
            for each Triangle t in Neighbors(A, f)
                if !Emitted(E,t)
                    for each Vertex v in t
                        Append(O,v) Output vertex
                        Push(D,v) Add to dead-end stack
                        Insert(N,v) Register as candidate
                        L[v] = L[v]-1 Decrease live triangle count
                        if s-C[v] > k If not in cache
                            C[v] = s Set time stamp
                            s = s+1 Increment time stamp
                    E[t] = true Flag triangle as emitted
            Select next fanning vertex
            f = Get-Next-Vertex(I,i,k,N,C,s,L,D)
        return O
        */
    // ...................................................................................

    int ivdx = 0;
    int ics = 1;
    int iStampCnt = mConfigCacheDepth+1;
    while (ivdx >= 0)   {

        unsigned int icnt = piNumTriPtrNoModify[ivdx];
        unsigned int* piList = adj.GetAdjacentTriangles(ivdx);
        unsigned int* piCurCandidate = piCandidates;

        // get all triangles in the neighborhood
        for (unsigned int tri = 0; tri < icnt;++tri)    {

            // if they have not yet been emitted, add them to the output IB
            const unsigned int fidx = *piList++;
            if (!abEmitted[fidx])   {

                // so iterate through all vertices of the current triangle
                const aiFace* pcFace = &pMesh->mFaces[ fidx ];
                unsigned nind = pcFace->mNumIndices;
                for (unsigned ind = 0; ind < nind; ind++) {
                    unsigned dp = pcFace->mIndices[ind];

                    // the current vertex won't have any free triangles after this step
                    if (ivdx != (int)dp) {
                        // append the vertex to the dead-end stack
                        sDeadEndVStack.push(dp);

                        // register as candidate for the next step
                        *piCurCandidate++ = dp;

                        // decrease the per-vertex triangle counts
                        piNumTriPtr[dp]--;
                    }

                    // append the vertex to the output index buffer
                    *piCSIter++ = dp;

                    // if the vertex is not yet in cache, set its cache count
                    if (iStampCnt-piCachingStamps[dp] > mConfigCacheDepth) {
                        piCachingStamps[dp] = iStampCnt++;
                        ++iCacheMisses;
                    }
                }
                // flag triangle as emitted
                abEmitted[fidx] = true;
            }
        }

        // the vertex has now no living adjacent triangles anymore
        piNumTriPtr[ivdx] = 0;

        // get next fanning vertex
        ivdx = -1;
        int max_priority = -1;
        for (unsigned int* piCur = piCandidates;piCur != piCurCandidate;++piCur)    {
            const unsigned int dp = *piCur;

            // must have live triangles
            if (piNumTriPtr[dp] > 0)    {
                int priority = 0;

                // will the vertex be in cache, even after fanning occurs?
                unsigned int tmp;
                if ((tmp = iStampCnt-piCachingStamps[dp]) + 2*piNumTriPtr[dp] <= mConfigCacheDepth) {
                    priority = tmp;
                }

                // keep best candidate
                if (priority > max_priority) {
                    max_priority = priority;
                    ivdx = dp;
                }
            }
        }
        // did we reach a dead end?
        if (-1 == ivdx) {
            // need to get a non-local vertex for which we have a good chance that it is still
            // in the cache ...
            while (!sDeadEndVStack.empty()) {
                unsigned int iCachedIdx = sDeadEndVStack.top();
                sDeadEndVStack.pop();
                if (piNumTriPtr[ iCachedIdx ] > 0)  {
                    ivdx = iCachedIdx;
                    break;
                }
            }

            if (-1 == ivdx) {
                // well, there isn't such a vertex. Simply get the next vertex in input order and
                // hope it is not too bad ...
                while (ics < (int)pMesh->mNumVertices)  {
                    ++ics;
                    if (piNumTriPtr[ics] > 0)   {
                        ivdx = ics;
                        break;
                    }
                }
            }
        }
    }
    ai_real fACMR2 = 0.0f;
    if (!DefaultLogger::isNullLogger()) {
        fACMR2 = (float)iCacheMisses / pMesh->mNumFaces;

        // very intense verbose logging ... prepare for much text if there are many meshes
        if ( DefaultLogger::get()->getLogSeverity() == Logger::VERBOSE) {
            ASSIMP_LOG_DEBUG_F("Mesh %u | ACMR in: ", meshNum, " out: ", fACMR, " | ~", fACMR2, ((fACMR - fACMR2) / fACMR) * 100.f);
        }

        fACMR2 *= pMesh->mNumFaces;
    }
    // sort the output index buffer back to the input array
    piCSIter = piIBOutput;
    for (aiFace* pcFace = pMesh->mFaces; pcFace != pcEnd;++pcFace)  {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;
        if (nind > 0) ind[0] = *piCSIter++;
        if (nind > 1) ind[1] = *piCSIter++;
        if (nind > 2) ind[2] = *piCSIter++;
    }

    // delete temporary storage
    delete[] piCachingStamps;
    delete[] piIBOutput;
    delete[] piCandidates;

    return fACMR2;
}